

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidgetPrivate::startDrag(QDockWidgetPrivate *this,DragScope scope)

{
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  DropAction DVar5;
  QLayoutItem *pQVar6;
  QDockWidgetGroupWindow *pQVar7;
  QMainWindowLayout *in_RDI;
  QDockWidgetPrivate *unaff_retaddr;
  DropAction result;
  QDockWidgetGroupWindow *floatingTab;
  QPoint *in_stack_00000030;
  bool wasFloating;
  QMainWindowLayout *layout;
  QDockWidget *q;
  QMainWindowLayout *in_stack_00000058;
  QDockWidgetGroupWindow *in_stack_ffffffffffffffa8;
  QMainWindowLayout *in_stack_ffffffffffffffb0;
  QLayoutItem *in_stack_ffffffffffffffb8;
  QMainWindowLayout *pQVar8;
  EndDragMode mode;
  
  pQVar8 = in_RDI;
  q_func((QDockWidgetPrivate *)in_RDI);
  mode = (EndDragMode)((ulong)pQVar8 >> 0x20);
  if (((in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d != (Data *)0x0) &&
     (((in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[1].super_QArrayData.alloc
      & 1) == 0)) {
    qt_mainwindow_layout_from_dock((QDockWidget *)in_stack_ffffffffffffffb0);
    bVar3 = QDockWidget::isFloating((QDockWidget *)0x58d027);
    pQVar6 = QMainWindowLayout::unplug(in_stack_00000058,(QWidget *)this,scope);
    *(QLayoutItem **)
     &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData =
         pQVar6;
    pDVar1 = (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d;
    lVar2._0_4_ = pDVar1[2].super_QArrayData.ref_;
    lVar2._4_4_ = pDVar1[2].super_QArrayData.flags;
    if (lVar2 == 0) {
      pQVar7 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58d073);
      if ((pQVar7 == (QDockWidgetGroupWindow *)0x0) ||
         (bVar4 = QDockWidget::isFloating((QDockWidget *)0x58d08a), bVar4)) {
        in_stack_ffffffffffffffb0 = (QMainWindowLayout *)operator_new(0x18);
        QDockWidgetItem::QDockWidgetItem
                  ((QDockWidgetItem *)in_stack_ffffffffffffffb0,
                   (QDockWidget *)in_stack_ffffffffffffffa8);
        *(QMainWindowLayout **)
         &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData =
             in_stack_ffffffffffffffb0;
      }
      else {
        in_stack_ffffffffffffffb8 = (QLayoutItem *)operator_new(0x18);
        QDockWidgetGroupWindowItem::QDockWidgetGroupWindowItem
                  ((QDockWidgetGroupWindowItem *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                  );
        *(QLayoutItem **)
         &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData =
             in_stack_ffffffffffffffb8;
      }
      *(undefined1 *)
       &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData.alloc
           = 1;
    }
    if (((in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[2].super_QArrayData.
         alloc & 0x10000) != 0) {
      QMainWindowLayout::restore
                (in_stack_ffffffffffffffb0,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    }
    *(undefined1 *)
     &(in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d[1].super_QArrayData.alloc =
         1;
    bVar4 = QMainWindowLayout::needsPlatformDrag();
    if (bVar4) {
      DVar5 = QMainWindowLayout::performPlatformWidgetDrag
                        ((QMainWindowLayout *)q,(QLayoutItem *)layout,in_stack_00000030);
      if ((DVar5 != IgnoreAction) || (bVar3)) {
        endDrag(unaff_retaddr,mode);
      }
      else {
        QMainWindowLayout::revert(in_RDI,in_stack_ffffffffffffffb8);
        pDVar1 = (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d;
        if (pDVar1 != (Data *)0x0) {
          operator_delete(pDVar1,0x30);
        }
        (in_RDI->layoutState).dockAreaLayout.docks[1].separatorWidgets.d.d = (Data *)0x0;
      }
    }
  }
  return;
}

Assistant:

void QDockWidgetPrivate::startDrag(DragScope scope)
{
    Q_Q(QDockWidget);

    if (state == nullptr || state->dragging)
        return;

    QMainWindowLayout *layout = qt_mainwindow_layout_from_dock(q);
    Q_ASSERT(layout != nullptr);

#if QT_CONFIG(draganddrop)
    bool wasFloating = q->isFloating();
#endif

    state->widgetItem = layout->unplug(q, scope);
    if (state->widgetItem == nullptr) {
        /*  Dock widget has a QMainWindow parent, but was never inserted with
            QMainWindow::addDockWidget, so the QMainWindowLayout has no
            widget item for it. It will be newly created and deleted if it doesn't
            get dropped into a dock area. */
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);
        if (floatingTab && !q->isFloating())
            state->widgetItem = new QDockWidgetGroupWindowItem(floatingTab);
        else
            state->widgetItem = new QDockWidgetItem(q);
        state->ownWidgetItem = true;
    }

    if (state->ctrlDrag)
        layout->restore();

    state->dragging = true;

#if QT_CONFIG(draganddrop)
    if (QMainWindowLayout::needsPlatformDrag()) {
        Qt::DropAction result =
                layout->performPlatformWidgetDrag(state->widgetItem, state->pressPos);
        if (result == Qt::IgnoreAction && !wasFloating) {
            layout->revert(state->widgetItem);
            delete state;
            state = nullptr;
        } else {
            endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);
        }
    }
#endif
}